

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O2

void toml::detail::skip_string_like<toml::type_config>
               (location *loc,context<toml::type_config> *param_2)

{
  element_type *peVar1;
  char_type_conflict cVar2;
  literal local_b0;
  region local_98;
  
  local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499a58;
  local_b0.value_ = "\"\"\"";
  local_b0.size_ = 3;
  literal::scan(&local_98,&local_b0,loc);
  peVar1 = local_98.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  region::~region(&local_98);
  if (peVar1 == (element_type *)0x0) {
    local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499a58;
    local_b0.value_ = "\'\'\'";
    local_b0.size_ = 3;
    literal::scan(&local_98,&local_b0,loc);
    peVar1 = local_98.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    region::~region(&local_98);
    if (peVar1 == (element_type *)0x0) {
      cVar2 = location::current(loc);
      if (cVar2 == '\"') {
        do {
          peVar1 = (loc->source_).
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if ((ulong)((long)(peVar1->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(peVar1->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start) <= loc->location_) {
            return;
          }
          location::advance(loc,1);
          cVar2 = location::current(loc);
        } while ((cVar2 != '\"') && (cVar2 = location::current(loc), cVar2 != '\n'));
      }
      else {
        cVar2 = location::current(loc);
        if (cVar2 != '\'') {
          return;
        }
        do {
          peVar1 = (loc->source_).
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if ((ulong)((long)(peVar1->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(peVar1->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start) <= loc->location_) {
            return;
          }
          location::advance(loc,1);
          cVar2 = location::current(loc);
        } while ((cVar2 != '\'') && (cVar2 = location::current(loc), cVar2 != '\n'));
      }
      location::advance(loc,1);
    }
    else {
      while (peVar1 = (loc->source_).
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,
            loc->location_ <
            (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start)) {
        local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499a58;
        local_b0.value_ = "\'\'\'";
        local_b0.size_ = 3;
        literal::scan(&local_98,&local_b0,loc);
        peVar1 = local_98.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        region::~region(&local_98);
        if (peVar1 != (element_type *)0x0) {
          return;
        }
        location::advance(loc,1);
      }
    }
  }
  else {
    while (peVar1 = (loc->source_).
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,
          loc->location_ <
          (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start)) {
      local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_00499a58;
      local_b0.value_ = "\"\"\"";
      local_b0.size_ = 3;
      literal::scan(&local_98,&local_b0,loc);
      peVar1 = local_98.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      region::~region(&local_98);
      if (peVar1 != (element_type *)0x0) {
        return;
      }
      location::advance(loc,1);
    }
  }
  return;
}

Assistant:

void skip_string_like(location& loc, const context<TC>&)
{
    // if """ is found, skip until the closing """ is found.
    if(literal("\"\"\"").scan(loc).is_ok())
    {
        while( ! loc.eof())
        {
            if(literal("\"\"\"").scan(loc).is_ok())
            {
                return;
            }
            loc.advance();
        }
    }
    else if(literal("'''").scan(loc).is_ok())
    {
        while( ! loc.eof())
        {
            if(literal("'''").scan(loc).is_ok())
            {
                return;
            }
            loc.advance();
        }
    }
    // if " is found, skip until the closing " or newline is found.
    else if(loc.current() == '"')
    {
        while( ! loc.eof())
        {
            loc.advance();
            if(loc.current() == '"' || loc.current() == '\n')
            {
                loc.advance();
                return;
            }
        }
    }
    else if(loc.current() == '\'')
    {
        while( ! loc.eof())
        {
            loc.advance();
            if(loc.current() == '\'' || loc.current() == '\n')
            {
                loc.advance();
                return ;
            }
        }
    }
    return;
}